

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 b;
  stbi__uint32 sVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  stbi_uc *psVar4;
  char *pcVar5;
  uchar *puVar6;
  stbi_uc *psVar7;
  stbi_uc *psVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc *psVar11;
  long in_FS_OFFSET;
  char c;
  undefined8 uStack_38;
  
  psVar7 = s->img_buffer_original;
  psVar4 = s->img_buffer_original_end;
  s->img_buffer = psVar7;
  s->img_buffer_end = psVar4;
  uStack_38 = in_RAX;
  if (psVar7 < psVar4) {
    s->img_buffer = psVar7 + 1;
    sVar9 = *psVar7;
    psVar11 = psVar7 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar9 = '\0';
    psVar11 = psVar7;
  }
  else {
    psVar11 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
    psVar7 = s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar7);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar9 = '\0';
    }
    else {
      psVar4 = psVar11 + iVar2;
      sVar9 = *psVar11;
    }
    s->img_buffer_end = psVar4;
    s->img_buffer = s->buffer_start + 1;
    psVar11 = s->buffer_start + 1;
  }
  if (psVar11 < psVar4) {
    psVar8 = psVar11 + 1;
    s->img_buffer = psVar8;
    sVar10 = *psVar11;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00125a95;
    psVar11 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
    psVar7 = s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar7);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar10 = '\0';
    }
    else {
      psVar4 = psVar11 + iVar2;
      sVar10 = *psVar11;
    }
    s->img_buffer_end = psVar4;
    psVar8 = s->buffer_start + 1;
    s->img_buffer = psVar8;
  }
  if ((sVar9 != 'P') || ((byte)(sVar10 - 0x37) < 0xfe)) {
LAB_00125a95:
    s->img_buffer = psVar7;
    s->img_buffer_end = s->img_buffer_original_end;
    return (void *)0x0;
  }
  s->img_n = (uint)(sVar10 == '6') * 2 + 1;
  if (psVar8 < psVar4) {
    s->img_buffer = psVar8 + 1;
    sVar9 = *psVar8;
  }
  else if (s->read_from_callbacks == 0) {
    sVar9 = '\0';
  }
  else {
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar7 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar9 = '\0';
    }
    else {
      psVar7 = psVar4 + iVar2;
      sVar9 = *psVar4;
    }
    s->img_buffer_end = psVar7;
    s->img_buffer = s->buffer_start + 1;
  }
  pcVar5 = (char *)((long)&uStack_38 + 7);
  uStack_38 = CONCAT17(sVar9,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,pcVar5);
  sVar1 = stbi__pnm_getinteger(s,pcVar5);
  s->img_x = sVar1;
  stbi__pnm_skip_whitespace(s,pcVar5);
  sVar1 = stbi__pnm_getinteger(s,pcVar5);
  s->img_y = sVar1;
  stbi__pnm_skip_whitespace(s,pcVar5);
  iVar2 = stbi__pnm_getinteger(s,pcVar5);
  if (iVar2 < 0x100) {
    if ((s->img_y < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar1 = s->img_y;
      *y = sVar1;
      iVar2 = s->img_n;
      if (comp != (int *)0x0) {
        *comp = iVar2;
        sVar1 = s->img_y;
      }
      b = s->img_x;
      iVar3 = stbi__mad3sizes_valid(iVar2,b,sVar1,0);
      if (iVar3 != 0) {
        puVar6 = (uchar *)stbi__malloc_mad3(iVar2,b,sVar1,0);
        if (puVar6 != (uchar *)0x0) {
          stbi__getn(s,puVar6,b * iVar2 * sVar1);
          if (s->img_n != 4) {
            puVar6 = stbi__convert_format(puVar6,s->img_n,s->img_x,s->img_y,req_comp);
            return puVar6;
          }
          return puVar6;
        }
        pcVar5 = "outofmem";
        goto LAB_00125c0e;
      }
    }
    pcVar5 = "too large";
  }
  else {
    pcVar5 = "max value > 255";
  }
LAB_00125c0e:
  *(char **)(in_FS_OFFSET + -8) = pcVar5;
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad3sizes_valid(s->img_n, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad3(s->img_n, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}